

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.h
# Opt level: O1

XYZ __thiscall pbrt::RGBColorSpace::ToXYZ(RGBColorSpace *this,RGB *rgb)

{
  undefined1 auVar1 [16];
  RGB *pRVar2;
  SquareMatrix<3> *pSVar3;
  int i;
  int iVar4;
  long lVar5;
  int j;
  Float *pFVar6;
  long lVar7;
  XYZ XVar8;
  Float local_1c;
  undefined8 local_18;
  
  pSVar3 = &this->XYZFromRGB;
  local_18 = 0;
  local_1c = 0.0;
  lVar5 = 0;
  do {
    iVar4 = (int)lVar5;
    pFVar6 = (Float *)&local_18;
    if ((iVar4 != 0) && (pFVar6 = (Float *)((long)&local_18 + 4), iVar4 != 1)) {
      pFVar6 = &local_1c;
    }
    *pFVar6 = 0.0;
    lVar7 = 0;
    do {
      pRVar2 = rgb;
      if (((int)lVar7 != 0) && (pRVar2 = (RGB *)&rgb->g, (int)lVar7 != 1)) {
        pRVar2 = (RGB *)&rgb->b;
      }
      pFVar6 = (Float *)&local_18;
      if ((iVar4 != 0) && (pFVar6 = (Float *)((long)&local_18 + 4), iVar4 != 1)) {
        pFVar6 = &local_1c;
      }
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)pRVar2->r),ZEXT416((uint)pSVar3->m[0][lVar7]),
                               ZEXT416((uint)*pFVar6));
      *pFVar6 = auVar1._0_4_;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    pSVar3 = (SquareMatrix<3> *)(pSVar3->m + 1);
  } while (lVar5 != 3);
  XVar8.Z = local_1c;
  XVar8.X = (Float)(undefined4)local_18;
  XVar8.Y = (Float)local_18._4_4_;
  return XVar8;
}

Assistant:

PBRT_CPU_GPU
    XYZ ToXYZ(const RGB &rgb) const { return Mul<XYZ>(XYZFromRGB, rgb); }